

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollwrap.c
# Opt level: O2

void pollwrap_add_fd_events(pollwrapper *pw,int fd,int events)

{
  short *psVar1;
  size_t sVar2;
  uint __line;
  int *e;
  pollfd *ppVar3;
  int *piVar4;
  char *__assertion;
  pollwrap_fdtopos f2p_find;
  
  if (fd < 0) {
    __assertion = "fd >= 0";
    __line = 0x4f;
LAB_00133933:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/utils/pollwrap.c"
                  ,__line,"void pollwrap_add_fd_events(pollwrapper *, int, int)");
  }
  f2p_find.fd = fd;
  e = (int *)find234(pw->fdtopos,&f2p_find,(cmpfn234)0x0);
  if (e == (int *)0x0) {
    ppVar3 = (pollfd *)safegrowarray(pw->fds,&pw->fdsize,8,pw->nfd,1,false);
    pw->fds = ppVar3;
    sVar2 = pw->nfd;
    pw->nfd = sVar2 + 1;
    ppVar3[sVar2].fd = fd;
    ppVar3[sVar2].events = 0;
    ppVar3[sVar2].revents = 0;
    e = (int *)safemalloc(1,0x10,0);
    *e = fd;
    *(size_t *)(e + 2) = sVar2;
    piVar4 = (int *)add234(pw->fdtopos,e);
    if (piVar4 != e) {
      __assertion = "added == f2p";
      __line = 0x5d;
      goto LAB_00133933;
    }
  }
  psVar1 = &pw->fds[*(long *)(e + 2)].events;
  *psVar1 = *psVar1 | (ushort)events;
  return;
}

Assistant:

void pollwrap_add_fd_events(pollwrapper *pw, int fd, int events)
{
    pollwrap_fdtopos *f2p, f2p_find;

    assert(fd >= 0);

    f2p_find.fd = fd;
    f2p = find234(pw->fdtopos, &f2p_find, NULL);
    if (!f2p) {
        sgrowarray(pw->fds, pw->fdsize, pw->nfd);
        size_t index = pw->nfd++;
        pw->fds[index].fd = fd;
        pw->fds[index].events = pw->fds[index].revents = 0;

        f2p = snew(pollwrap_fdtopos);
        f2p->fd = fd;
        f2p->pos = index;
        pollwrap_fdtopos *added = add234(pw->fdtopos, f2p);
        assert(added == f2p);
    }

    pw->fds[f2p->pos].events |= events;
}